

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void fulfill_or_reject_promise(JSContext *ctx,JSValue promise,JSValue value,BOOL is_reject)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  undefined8 uVar4;
  JSHostPromiseRejectionTracker *pJVar5;
  JSPromiseReactionData *pJVar6;
  list_head *plVar7;
  list_head *plVar8;
  JSValue v;
  JSValueUnion JVar9;
  JSPromiseReactionData *pJVar10;
  JSValueUnion local_88;
  int64_t iStack_80;
  JSValueUnion local_78;
  int64_t iStack_70;
  JSValueUnion local_68;
  int64_t iStack_60;
  ulong local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  JVar9 = value.u;
  if (((((int)promise.tag == -1) && (*(short *)((long)promise.u.ptr + 6) == 0x2a)) &&
      (piVar2 = *(int **)((long)promise.u.ptr + 0x30), piVar2 != (int *)0x0)) && (*piVar2 == 0)) {
    if (0xfffffff4 < (uint)value.tag) {
      *(int *)JVar9.ptr = *JVar9.ptr + 1;
    }
    piVar3 = (int *)(((JSValue *)(piVar2 + 0xc))->u).ptr;
    uVar4 = *(undefined8 *)(piVar2 + 0xe);
    v = *(JSValue *)(piVar2 + 0xc);
    ((JSValueUnion *)(piVar2 + 0xc))->ptr = (void *)JVar9;
    *(int64_t *)(piVar2 + 0xe) = value.tag;
    if ((0xfffffff4 < (uint)uVar4) && (iVar1 = *piVar3, *piVar3 = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    *piVar2 = is_reject + 1;
    if ((is_reject + 1 == 2) && (piVar2[10] == 0)) {
      pJVar5 = ctx->rt->host_promise_rejection_tracker;
      if (pJVar5 != (JSHostPromiseRejectionTracker *)0x0) {
        (*pJVar5)(ctx,promise,value,0,ctx->rt->host_promise_rejection_tracker_opaque);
      }
    }
    if (*(JSPromiseReactionData **)(piVar2 + (long)is_reject * 4 + 4) !=
        (JSPromiseReactionData *)(piVar2 + (long)is_reject * 4 + 2)) {
      pJVar10 = *(JSPromiseReactionData **)(piVar2 + (long)is_reject * 4 + 4);
      do {
        pJVar6 = (JSPromiseReactionData *)(pJVar10->link).next;
        local_88 = pJVar10->resolving_funcs[0].u;
        iStack_80 = pJVar10->resolving_funcs[0].tag;
        local_78 = pJVar10->resolving_funcs[1].u;
        iStack_70 = pJVar10->resolving_funcs[1].tag;
        local_68 = (pJVar10->handler).u;
        iStack_60 = (pJVar10->handler).tag;
        local_50 = 1;
        local_58 = (ulong)(is_reject != 0);
        local_48 = JVar9;
        local_40 = value.tag;
        JS_EnqueueJob(ctx,promise_reaction_job,5,(JSValue *)&local_88);
        plVar7 = (pJVar10->link).prev;
        plVar8 = (pJVar10->link).next;
        plVar7->next = plVar8;
        plVar8->prev = plVar7;
        (pJVar10->link).prev = (list_head *)0x0;
        (pJVar10->link).next = (list_head *)0x0;
        promise_reaction_data_free(ctx->rt,pJVar10);
        pJVar10 = pJVar6;
      } while (pJVar6 != (JSPromiseReactionData *)(piVar2 + (long)is_reject * 4 + 2));
    }
    pJVar10 = *(JSPromiseReactionData **)(piVar2 + (long)(1 - is_reject) * 4 + 4);
    while (pJVar10 != (JSPromiseReactionData *)(piVar2 + (long)(1 - is_reject) * 4 + 2)) {
      plVar7 = (pJVar10->link).prev;
      pJVar6 = (JSPromiseReactionData *)(pJVar10->link).next;
      plVar7->next = (list_head *)pJVar6;
      (pJVar6->link).prev = plVar7;
      (pJVar10->link).prev = (list_head *)0x0;
      (pJVar10->link).next = (list_head *)0x0;
      promise_reaction_data_free(ctx->rt,pJVar10);
      pJVar10 = pJVar6;
    }
  }
  return;
}

Assistant:

static void fulfill_or_reject_promise(JSContext *ctx, JSValueConst promise,
                                      JSValueConst value, BOOL is_reject)
{
    JSPromiseData *s = JS_GetOpaque(promise, JS_CLASS_PROMISE);
    struct list_head *el, *el1;
    JSPromiseReactionData *rd;
    JSValueConst args[5];

    if (!s || s->promise_state != JS_PROMISE_PENDING)
        return; /* should never happen */
    set_value(ctx, &s->promise_result, JS_DupValue(ctx, value));
    s->promise_state = JS_PROMISE_FULFILLED + is_reject;
#ifdef DUMP_PROMISE
    printf("fulfill_or_reject_promise: is_reject=%d\n", is_reject);
#endif
    if (s->promise_state == JS_PROMISE_REJECTED && !s->is_handled) {
        JSRuntime *rt = ctx->rt;
        if (rt->host_promise_rejection_tracker) {
            rt->host_promise_rejection_tracker(ctx, promise, value, FALSE,
                                               rt->host_promise_rejection_tracker_opaque);
        }
    }

    list_for_each_safe(el, el1, &s->promise_reactions[is_reject]) {
        rd = list_entry(el, JSPromiseReactionData, link);
        args[0] = rd->resolving_funcs[0];
        args[1] = rd->resolving_funcs[1];
        args[2] = rd->handler;
        args[3] = JS_NewBool(ctx, is_reject);
        args[4] = value;
        JS_EnqueueJob(ctx, promise_reaction_job, 5, args);
        list_del(&rd->link);
        promise_reaction_data_free(ctx->rt, rd);
    }

    list_for_each_safe(el, el1, &s->promise_reactions[1 - is_reject]) {
        rd = list_entry(el, JSPromiseReactionData, link);
        list_del(&rd->link);
        promise_reaction_data_free(ctx->rt, rd);
    }
}